

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O3

void mpiabi_intercomm_create_
               (MPIABI_Fint *local_comm,MPIABI_Fint *local_leader,MPIABI_Fint *peer_comm,
               MPIABI_Fint *remote_leader,MPIABI_Fint *tag,MPIABI_Fint *newintercomm,
               MPIABI_Fint *ierror)

{
  mpi_intercomm_create_();
  return;
}

Assistant:

void mpiabi_intercomm_create_(
  const MPIABI_Fint * local_comm,
  const MPIABI_Fint * local_leader,
  const MPIABI_Fint * peer_comm,
  const MPIABI_Fint * remote_leader,
  const MPIABI_Fint * tag,
  MPIABI_Fint * newintercomm,
  MPIABI_Fint * ierror
) {
  return mpi_intercomm_create_(
    local_comm,
    local_leader,
    peer_comm,
    remote_leader,
    tag,
    newintercomm,
    ierror
  );
}